

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

_Bool start_game(_Bool new_game)

{
  player *p;
  _Bool _Var1;
  char *fname;
  
  player->is_dead = true;
  fname = savefile;
  savefile_get_panic_name(panicfile,0x400,savefile);
  safe_setuid_grab();
  if (savefile[0] != '\0') {
    _Var1 = file_exists(panicfile);
    safe_setuid_drop();
    if (!_Var1) goto LAB_001e913a;
    safe_setuid_grab();
    _Var1 = file_newer(panicfile,savefile);
    safe_setuid_drop();
    if (_Var1) {
      _Var1 = get_check("A panic save exists.  Use it? ");
      fname = savefile;
      if (_Var1) {
        fname = panicfile;
      }
      goto LAB_001e913a;
    }
    safe_setuid_grab();
    file_delete(panicfile);
  }
  fname = savefile;
  safe_setuid_drop();
LAB_001e913a:
  safe_setuid_grab();
  _Var1 = file_exists(fname);
  safe_setuid_drop();
  if ((!_Var1) || (_Var1 = savefile_load(fname,arg_wizard), _Var1)) {
    if ((new_game | player->is_dead) == 1) {
      character_generated = false;
      textui_do_birth();
    }
    else {
      update_player_object_knowledge(player);
    }
    event_signal(EVENT_LEAVE_INIT);
    event_signal(EVENT_ENTER_GAME);
    event_signal(EVENT_ENTER_WORLD);
    p = player;
    player->upkeep->autosave = false;
    if (character_dungeon == false) {
      prepare_next_level(p);
    }
    on_new_level();
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool start_game(bool new_game)
{
	const char *loadpath = savefile;
	bool exists;

	/* Player will be resuscitated if living in the savefile */
	player->is_dead = true;

	/* Try loading */
	savefile_get_panic_name(panicfile, sizeof(panicfile), loadpath);
	safe_setuid_grab();
	exists = loadpath[0] && file_exists(panicfile);
	safe_setuid_drop();
	if (exists) {
		bool newer;

		safe_setuid_grab();
		newer = file_newer(panicfile, loadpath);
		safe_setuid_drop();
		if (newer) {
			if (get_check("A panic save exists.  Use it? ")) {
				loadpath = panicfile;
			}
		} else {
			/* Remove the out-of-date panic save. */
			safe_setuid_grab();
			file_delete(panicfile);
			safe_setuid_drop();
		}
	}
	safe_setuid_grab();
	exists = file_exists(loadpath);
	safe_setuid_drop();
	if (exists && !savefile_load(loadpath, arg_wizard)) {
		return false;
	}

	/* No living character loaded */
	if (player->is_dead || new_game) {
		character_generated = false;
		textui_do_birth();
	} else {
		/*
		 * Bring the stock curse objects up-to-date with what the
		 * player knows.
		 */
		update_player_object_knowledge(player);
	}

	/* Tell the UI we've started. */
	event_signal(EVENT_LEAVE_INIT);
	event_signal(EVENT_ENTER_GAME);
	event_signal(EVENT_ENTER_WORLD);

	/* Save not required yet. */
	player->upkeep->autosave = false;

	/* Enter the level, generating a new one if needed */
	if (!character_dungeon) {
		prepare_next_level(player);
	}
	on_new_level();

	return true;
}